

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

int __thiscall FIX::FileLog::init(FileLog *this,EVP_PKEY_CTX *ctx)

{
  _Ios_Openmode _Var1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ConfigError *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *prefix_local;
  string *backupPath_local;
  string *path_local;
  FileLog *this_local;
  
  local_28 = in_RCX;
  backupPath_local = (string *)ctx;
  path_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  file_mkdir(pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  file_mkdir(pcVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)ctx,".");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)in_RDX,(string *)ctx);
  }
  std::operator+(&local_68,local_28,".");
  file_appendpath(&local_48,(string *)ctx,&local_68);
  std::__cxx11::string::operator=((string *)&this->m_fullPrefix,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_b8,local_28,".");
  file_appendpath(&local_98,in_RDX,&local_b8);
  std::__cxx11::string::operator=((string *)&this->m_fullBackupPrefix,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator+(&local_d8,&this->m_fullPrefix,"messages.current.log");
  std::__cxx11::string::operator=((string *)&this->m_messagesFileName,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_f8,&this->m_fullPrefix,"event.current.log");
  std::__cxx11::string::operator=((string *)&this->m_eventFileName,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  _Var1 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_app);
  std::ofstream::open((char *)&this->m_messages,_Var1);
  uVar4 = std::ofstream::is_open();
  if ((uVar4 & 1) != 0) {
    _Var1 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_app);
    std::ofstream::open((char *)&this->m_event,_Var1);
    uVar2 = std::ofstream::is_open();
    if ((uVar2 & 1) != 0) {
      return uVar2;
    }
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_140,"Could not open event file: ",&this->m_eventFileName);
    ConfigError::ConfigError(pCVar5,&local_140);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_119 = 1;
  pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_118,"Could not open messages file: ",&this->m_messagesFileName);
  ConfigError::ConfigError(pCVar5,&local_118);
  local_119 = 0;
  __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

void FileLog::init( std::string path, std::string backupPath, const std::string& prefix )
{
  file_mkdir( path.c_str() );
  file_mkdir( backupPath.c_str() );

  if ( path.empty() ) path = ".";
  if ( backupPath.empty() ) backupPath = path;

  m_fullPrefix
    = file_appendpath(path, prefix + ".");
  m_fullBackupPrefix
    = file_appendpath(backupPath, prefix + ".");

  m_messagesFileName = m_fullPrefix + "messages.current.log";
  m_eventFileName = m_fullPrefix + "event.current.log";

  m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_messages.is_open() ) throw ConfigError( "Could not open messages file: " + m_messagesFileName );
  m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_event.is_open() ) throw ConfigError( "Could not open event file: " + m_eventFileName );
}